

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWOBFile(LWOImporter *this)

{
  uint8_t *puVar1;
  bool bVar2;
  DeadlyImportError *this_00;
  Logger *pLVar3;
  ulong uVar4;
  uint8_t *next;
  allocator<char> local_49;
  string local_48;
  ChunkHeader local_24;
  ChunkHeader head;
  bool running;
  uint8_t *end;
  LWOImporter *this_local;
  
  register0x00000000 = this->mFileBuffer + this->fileSize;
  head.type._3_1_ = 1;
  while (((head.type._3_1_ & 1) != 0 && (this->mFileBuffer + 8 <= stack0xffffffffffffffe8))) {
    local_24 = IFF::LoadChunk(&this->mFileBuffer);
    if (stack0xffffffffffffffe8 < this->mFileBuffer + local_24.length) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"LWOB: Invalid chunk length",&local_49);
      DeadlyImportError::DeadlyImportError(this_00,&local_48);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    puVar1 = this->mFileBuffer;
    uVar4 = (ulong)local_24.length;
    if (local_24.type == 0x504e5453) {
      bVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                        (&this->mCurLayer->mTempPoints);
      if (bVar2) {
        LoadLWOPoints(this,local_24.length);
      }
      else {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,"LWO: PNTS chunk encountered twice");
      }
    }
    else if (local_24.type == 0x504f4c53) {
      bVar2 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::empty
                        (&this->mCurLayer->mFaces);
      if (bVar2) {
        LoadLWOBPolygons(this,local_24.length);
      }
      else {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,"LWO: POLS chunk encountered twice");
      }
    }
    else if (local_24.type == 0x53524653) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(this->mTags);
      if (bVar2) {
        LoadLWOTags(this,local_24.length);
      }
      else {
        pLVar3 = DefaultLogger::get();
        Logger::warn(pLVar3,"LWO: SRFS chunk encountered twice");
      }
    }
    else if (local_24.type == 0x53555246) {
      LoadLWOBSurface(this,local_24.length);
    }
    this->mFileBuffer = puVar1 + uVar4;
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOBFile()
{
    LE_NCONST uint8_t* const end = mFileBuffer + fileSize;
    bool running = true;
    while (running)
    {
        if (mFileBuffer + sizeof(IFF::ChunkHeader) > end)break;
        const IFF::ChunkHeader head = IFF::LoadChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
        {
            throw DeadlyImportError("LWOB: Invalid chunk length");
            break;
        }
        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // vertex list
        case AI_LWO_PNTS:
            {
                if (!mCurLayer->mTempPoints.empty())
                    ASSIMP_LOG_WARN("LWO: PNTS chunk encountered twice");
                else LoadLWOPoints(head.length);
                break;
            }
            // face list
        case AI_LWO_POLS:
            {

                if (!mCurLayer->mFaces.empty())
                    ASSIMP_LOG_WARN("LWO: POLS chunk encountered twice");
                else LoadLWOBPolygons(head.length);
                break;
            }
            // list of tags
        case AI_LWO_SRFS:
            {
                if (!mTags->empty())
                    ASSIMP_LOG_WARN("LWO: SRFS chunk encountered twice");
                else LoadLWOTags(head.length);
                break;
            }

            // surface chunk
        case AI_LWO_SURF:
            {
                LoadLWOBSurface(head.length);
                break;
            }
        }
        mFileBuffer = next;
    }
}